

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

size_t zt_cstr_int_display_len(int value)

{
  int result;
  int value_local;
  size_t local_8;
  
  result = 2;
  value_local = value;
  if (-1 < value) {
    result = 1;
  }
  for (; 999 < value_local || value_local < -999; value_local = value_local / 1000) {
    result = result + 3;
  }
  if ((value_local < 100) && (-100 < value_local)) {
    if ((value_local < 10) && (-10 < value_local)) {
      local_8 = (size_t)result;
    }
    else {
      local_8 = (size_t)(result + 1);
    }
  }
  else {
    local_8 = (size_t)(result + 2);
  }
  return local_8;
}

Assistant:

size_t zt_cstr_int_display_len(int value)
{
    int result;
    result = value >= 0 ? 1 : 2;

    while ((value >= 1000) || (value <= -1000)) {
        result += 3;
        value /= 1000;
    }

    if ((value >= 100) || (value <= -100)) {
        return result + 2;
    }

    if ((value >= 10) || (value <= -10)) {
        return result + 1;
    }

    return result;
}